

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

int __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::remove
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Iterator *pIVar4;
  
  pIVar1 = *(Item **)__filename;
  pIVar2 = pIVar1->nextCell;
  *pIVar1->cell = pIVar2;
  if (pIVar2 != (Item *)0x0) {
    pIVar1->nextCell->cell = pIVar1->cell;
  }
  pIVar2 = pIVar1->prev;
  pIVar3 = pIVar1->next;
  pIVar4 = (Iterator *)&pIVar2->next;
  if (pIVar2 == (Item *)0x0) {
    pIVar4 = &this->_begin;
  }
  pIVar4->item = pIVar3;
  pIVar3->prev = pIVar2;
  this->_size = this->_size - 1;
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  return (int)pIVar1->next;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }